

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::DescriptorProto::_InternalSerialize
          (DescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  MessageOptions *value;
  size_t __n;
  bool bVar2;
  anon_union_224_1_493b367e_for_DescriptorProto_3 aVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *value_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *value_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *value_02;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *value_03;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *value_04;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar5;
  uint8_t *puVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  char *in_R9;
  undefined8 *puVar11;
  string_view s;
  string_view s_00;
  string_view field_name;
  string_view field_name_00;
  
  aVar3 = this->field_0;
  if (((undefined1  [224])aVar3 & (undefined1  [224])0x1) != (undefined1  [224])0x0) {
    puVar11 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.DescriptorProto.name";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar11,(char *)(ulong)*(uint *)(puVar11 + 1),1,0x24,field_name);
    s._M_str = (char *)*puVar11;
    s._M_len = puVar11[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      pVVar4 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(this->field_0)._impl_.field_.super_RepeatedPtrFieldBase,iVar10);
      target = internal::WireFormatLite::InternalWriteMessage
                         (2,(MessageLite *)pVVar4,(pVVar4->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      value_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(this->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,iVar10);
      target = internal::WireFormatLite::InternalWriteMessage
                         (3,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      value_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                           (&(this->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,iVar10);
      target = internal::WireFormatLite::InternalWriteMessage
                         (4,(MessageLite *)value_01,(value_01->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x58);
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      value_02 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                           (&(this->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,
                            iVar10);
      target = internal::WireFormatLite::InternalWriteMessage
                         (5,(MessageLite *)value_02,(value_02->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x70);
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      pVVar4 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(this->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar10);
      target = internal::WireFormatLite::InternalWriteMessage
                         (6,(MessageLite *)pVVar4,(pVVar4->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  if (((undefined1  [224])aVar3 & (undefined1  [224])0x2) != (undefined1  [224])0x0) {
    value = (this->field_0)._impl_.options_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (7,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x88);
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      value_03 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                           (&(this->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,iVar10);
      target = internal::WireFormatLite::InternalWriteMessage
                         (8,(MessageLite *)value_03,(value_03->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0xa0);
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      value_04 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                           (&(this->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase,
                            iVar10);
      target = internal::WireFormatLite::InternalWriteMessage
                         (9,(MessageLite *)value_04,(value_04->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0xb8);
  if (0 < iVar1) {
    iVar10 = 0;
    do {
      pVVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase,iVar10);
      field_name_00._M_str = in_R9;
      field_name_00._M_len = (size_t)"google.protobuf.DescriptorProto.reserved_name";
      internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)(pVVar5->_M_dataplus)._M_p,
                 (char *)(ulong)(uint)pVVar5->_M_string_length,1,0x2d,field_name_00);
      __n = pVVar5->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = 0x52;
        target[1] = (byte)__n;
        memcpy(target + 2,(pVVar5->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        s_00._M_str = (pVVar5->_M_dataplus)._M_p;
        s_00._M_len = __n;
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,10,s_00,target);
      }
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  if (((undefined1  [224])aVar3 & (undefined1  [224])0x4) != (undefined1  [224])0x0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar8 = (ulong)(this->field_0)._impl_.visibility_;
    pbVar7 = target + 1;
    *target = 0x58;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar7 = (byte)uVar9 | 0x80;
        uVar8 = uVar9 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar2 = 0x3fff < uVar9;
        uVar9 = uVar8;
      } while (bVar2);
    }
    *pbVar7 = (byte)uVar8;
    target = pbVar7 + 1;
  }
  uVar9 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar9 & 1) != 0) {
    puVar6 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar9 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar6;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL DescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const DescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.DescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_nested_type_size());
       i < n; i++) {
    const auto& repfield = this_._internal_nested_type().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_enum_type_size());
       i < n; i++) {
    const auto& repfield = this_._internal_enum_type().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            4, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_extension_range_size());
       i < n; i++) {
    const auto& repfield = this_._internal_extension_range().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            5, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_extension_size());
       i < n; i++) {
    const auto& repfield = this_._internal_extension().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            6, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        7, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_oneof_decl_size());
       i < n; i++) {
    const auto& repfield = this_._internal_oneof_decl().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            8, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_reserved_range_size());
       i < n; i++) {
    const auto& repfield = this_._internal_reserved_range().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            9, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this_._internal_reserved_name_size(); i < n; ++i) {
    const auto& s = this_._internal_reserved_name().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.DescriptorProto.reserved_name");
    target = stream->WriteString(10, s, target);
  }

  // optional .google.protobuf.SymbolVisibility visibility = 11;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        11, this_._internal_visibility(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto)
  return target;
}